

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpMessage.cpp
# Opt level: O2

string * __thiscall FIX::HttpMessage::toString(HttpMessage *this,string *str)

{
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  getParameterString_abi_cxx11_(&sStack_58,this);
  std::operator+(&local_38,&this->m_root,&sStack_58);
  std::__cxx11::string::operator=((string *)str,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_58);
  return str;
}

Assistant:

std::string &HttpMessage::toString(std::string &str) const {
  str = m_root + getParameterString();
  return str;
}